

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCluster.cpp
# Opt level: O3

uint64 __thiscall
libmatroska::KaxCluster::GetBlockGlobalTimecode(KaxCluster *this,int16 GlobalSavedTimecode)

{
  long lVar1;
  EbmlUInteger *this_00;
  uint64 uVar2;
  
  if (this->bFirstFrameInside == false) {
    this_00 = (EbmlUInteger *)
              libebml::EbmlMaster::FindElt
                        (&this->super_EbmlMaster,(EbmlCallbacks *)KaxClusterTimecode::ClassInfos);
    if (this->bFirstFrameInside == false) {
      __assert_fail("bFirstFrameInside",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxCluster.cpp"
                    ,0x113,"uint64 libmatroska::KaxCluster::GetBlockGlobalTimecode(int16)");
    }
    uVar2 = libebml::EbmlUInteger::operator_cast_to_unsigned_long(this_00);
    this->PreviousTimecode = uVar2;
    this->MaxTimecode = uVar2;
    this->MinTimecode = uVar2;
    this->bFirstFrameInside = true;
    this->bPreviousTimecodeIsSet = true;
  }
  if (this->bTimecodeScaleIsSet != false) {
    lVar1 = this->TimecodeScale;
    uVar2 = GlobalTimecode(this);
    return uVar2 + GlobalSavedTimecode * lVar1;
  }
  __assert_fail("bTimecodeScaleIsSet",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/./matroska/KaxCluster.h"
                ,0x7b,"uint64 libmatroska::KaxCluster::GlobalTimecodeScale() const");
}

Assistant:

uint64 KaxCluster::GetBlockGlobalTimecode(int16 GlobalSavedTimecode)
{
  if (!bFirstFrameInside) {
    KaxClusterTimecode * Timecode = static_cast<KaxClusterTimecode *>(this->FindElt(EBML_INFO(KaxClusterTimecode)));
    assert (bFirstFrameInside); // use the InitTimecode() hack for now
    MinTimecode = MaxTimecode = PreviousTimecode = *static_cast<EbmlUInteger *>(Timecode);
    bFirstFrameInside = true;
    bPreviousTimecodeIsSet = true;
  }
  return int64(GlobalSavedTimecode * GlobalTimecodeScale()) + GlobalTimecode();
}